

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O2

CSVOption<duckdb::StrpTimeFormat> *
duckdb::CSVOption<duckdb::StrpTimeFormat>::Deserialize
          (CSVOption<duckdb::StrpTimeFormat> *__return_storage_ptr__,Deserializer *deserializer)

{
  CSVOption(__return_storage_ptr__);
  Deserializer::ReadPropertyWithDefault<bool>
            (deserializer,100,"set_by_user",&__return_storage_ptr__->set_by_user);
  Deserializer::ReadProperty<duckdb::StrpTimeFormat>
            (deserializer,0x65,"value",&__return_storage_ptr__->value);
  return __return_storage_ptr__;
}

Assistant:

CSVOption<T> CSVOption<T>::Deserialize(Deserializer &deserializer) {
	CSVOption<T> result;
	deserializer.ReadPropertyWithDefault<bool>(100, "set_by_user", result.set_by_user);
	deserializer.ReadProperty<T>(101, "value", result.value);
	return result;
}